

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void read_numeral(LexState *ls,SemInfo *seminfo)

{
  char cVar1;
  ushort uVar2;
  ZIO *pZVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  ushort **ppuVar7;
  size_t sVar8;
  ulong uVar9;
  char *s;
  
  uVar5 = ls->current;
  do {
    save(ls,uVar5);
    pZVar3 = ls->z;
    sVar8 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar8 == 0) {
      uVar5 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    ls->current = uVar5;
    ppuVar7 = __ctype_b_loc();
  } while ((uVar5 == 0x2e) || (((*ppuVar7)[(int)uVar5] & 0x800) != 0));
  iVar6 = check_next(ls,"Ee");
  if (iVar6 != 0) {
    check_next(ls,"+-");
  }
  uVar9 = (ulong)ls->current;
  if (uVar9 == 0x5f) goto LAB_0010d055;
  uVar2 = (*ppuVar7)[uVar9];
  while ((uVar2 & 8) != 0) {
LAB_0010d055:
    do {
      save(ls,(int)uVar9);
      pZVar3 = ls->z;
      sVar8 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar8 == 0) {
        uVar5 = luaZ_fill(pZVar3);
        uVar9 = (ulong)uVar5;
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar9 = (ulong)*pbVar4;
      }
      iVar6 = (int)uVar9;
      ls->current = iVar6;
    } while (iVar6 == 0x5f);
    uVar2 = (*ppuVar7)[iVar6];
  }
  save(ls,0);
  s = ls->buff->buffer;
  sVar8 = ls->buff->n;
  if (sVar8 != 0) {
    cVar1 = ls->decpoint;
    do {
      if (s[sVar8 - 1] == '.') {
        s[sVar8 - 1] = cVar1;
      }
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
    s = ls->buff->buffer;
  }
  iVar6 = luaO_str2d(s,&seminfo->r);
  if (iVar6 != 0) {
    return;
  }
  luaX_lexerror(ls,"malformed number",0x11c);
}

Assistant:

static void read_numeral(LexState*ls,SemInfo*seminfo){
do{
save_and_next(ls);
}while(isdigit(ls->current)||ls->current=='.');
if(check_next(ls,"Ee"))
check_next(ls,"+-");
while(isalnum(ls->current)||ls->current=='_')
save_and_next(ls);
save(ls,'\0');
buffreplace(ls,'.',ls->decpoint);
if(!luaO_str2d(luaZ_buffer(ls->buff),&seminfo->r))
luaX_lexerror(ls,"malformed number",TK_NUMBER);
}